

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubD::GetMarkedComponents
          (ON_SubD *this,bool bAddMarkedComponents,ON__UINT8 mark_bits,bool bIncludeVertices,
          bool bIncludeEdges,bool bIncludeFaces,ON_SimpleArray<ON_SubDComponentPtr> *component_list)

{
  bool bVar1;
  ON_SubDVertex *pOVar2;
  undefined3 in_register_00000009;
  uint uVar3;
  undefined7 in_register_00000081;
  ulong uVar4;
  char cVar5;
  undefined7 in_register_00000089;
  ulong uVar6;
  ON_SubDVertexIterator vit;
  ON_SubDComponentPtr local_80;
  uint local_78;
  uint local_74;
  ON_SubD *local_70;
  ON_SubDEdgeIterator local_68;
  
  uVar6 = CONCAT71(in_register_00000089,bIncludeFaces);
  uVar4 = CONCAT71(in_register_00000081,bIncludeEdges);
  uVar3 = 0;
  local_78 = (uint)uVar6;
  local_70 = this;
  if (CONCAT31(in_register_00000009,bIncludeVertices) != 0) {
    local_74 = (uint)uVar4;
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_68,this);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    uVar3 = 0;
    pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
    while (pOVar2 != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::IsMarked(&(pOVar2->super_ON_SubDComponentBase).m_status,mark_bits)
      ;
      if (bVar1 == bAddMarkedComponents) {
        local_80.m_ptr = (ulong)pOVar2 | 2;
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&local_80);
        uVar3 = uVar3 + 1;
      }
      pOVar2 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_68);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
    uVar6 = (ulong)local_78;
    uVar4 = (ulong)local_74;
  }
  cVar5 = (char)uVar6;
  if ((char)uVar4 != '\0') {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_68,local_70);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
    while (pOVar2 != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::IsMarked(&(pOVar2->super_ON_SubDComponentBase).m_status,mark_bits)
      ;
      if (bVar1 == bAddMarkedComponents) {
        local_80.m_ptr = (ulong)pOVar2 | 4;
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&local_80);
        uVar3 = uVar3 + 1;
      }
      pOVar2 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_68);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
    cVar5 = (char)local_78;
  }
  if (cVar5 != '\0') {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_68,local_70);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
    while (pOVar2 != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::IsMarked(&(pOVar2->super_ON_SubDComponentBase).m_status,mark_bits)
      ;
      if (bVar1 == bAddMarkedComponents) {
        local_80.m_ptr = (ulong)pOVar2 | 6;
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&local_80);
        uVar3 = uVar3 + 1;
      }
      pOVar2 = (ON_SubDVertex *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_68);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubD::GetMarkedComponents(
  bool bAddMarkedComponents,
  ON__UINT8 mark_bits,
  bool bIncludeVertices,
  bool bIncludeEdges,
  bool bIncludeFaces,
  ON_SimpleArray< ON_SubDComponentPtr >& component_list
) const
{
  bAddMarkedComponents = bAddMarkedComponents ? true : false; // so we can use == on boolean values
  unsigned int mark_count = 0;

  if (bIncludeVertices)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bAddMarkedComponents == v->m_status.IsMarked(mark_bits))
      {
        component_list.Append(v->ComponentPtr());
        mark_count++;
      }
    }
  }

  if (bIncludeEdges)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bAddMarkedComponents == e->m_status.IsMarked(mark_bits))
      {
        component_list.Append(e->ComponentPtr());
        mark_count++;
      }
    }
  }

  if (bIncludeFaces)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bAddMarkedComponents == f->m_status.IsMarked(mark_bits))
      {
        component_list.Append(f->ComponentPtr());
        mark_count++;
      }
    }
  }

  return mark_count;
}